

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionShape.h
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionShapeRectangular::~ChBeamSectionShapeRectangular
          (ChBeamSectionShapeRectangular *this)

{
  (this->super_ChBeamSectionShape)._vptr_ChBeamSectionShape =
       (_func_int **)&PTR__ChBeamSectionShapeRectangular_00b25968;
  std::
  vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
  ::~vector(&this->ml_normals);
  std::
  vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
  ::~vector(&this->ml_points);
  operator_delete(this,0x48);
  return;
}

Assistant:

class ChApi ChBeamSectionShapeRectangular : public ChBeamSectionShape {
  public:
    ChBeamSectionShapeRectangular(double y_width, double z_width) {
        z_thick = z_width;
        y_thick = y_width;
        this->UpdateProfile();
    }

    //
    // Functions for drawing the shape via triangulation:
    //

    virtual int GetNofLines() const override { return 4; };

    virtual int GetNofPoints(const int i_line) const override { return 2; };

    /// Compute the points (in the reference of the section).
    /// Note: mpoints must already have the proper size.
    virtual void GetPoints(const int i_line, std::vector<ChVector<>>& mpoints) const override {
        mpoints = ml_points[i_line];
    };

    /// Compute the normals (in the reference of the section) at each point.
    /// Note: mnormals must already have the proper size.
    virtual void GetNormals(const int i_line, std::vector<ChVector<>>& mnormals) const override {
        mnormals = ml_normals[i_line];
    }

    /// Returns the axis-aligned bounding box (assuming axes of local reference of the section)
    virtual void GetAABB(double& ymin, double& ymax, double& zmin, double& zmax) const override;

  private:
    // internal: update internal precomputed vertex arrays
    void UpdateProfile();

    double y_thick;
    double z_thick;
    std::vector<std::vector<ChVector<>>> ml_points;
    std::vector<std::vector<ChVector<>>> ml_normals;
}